

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::try_to_store_message_from_timer_to_queue
          (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,type_index *msg_type,message_ref_t *message,invocation_type_t demand_type)

{
  unique_lock<std::mutex> lock;
  deliver_op_tracer tracer;
  unique_lock<std::mutex> local_60;
  deliver_op_tracer local_50;
  
  local_50.m_tracer = (this->super_mchain_tracing_enabled_base).m_tracer;
  local_50.m_op_name = "service_request";
  if (demand_type == event) {
    local_50.m_op_name = "message";
  }
  local_60._M_device = &this->m_lock;
  local_60._M_owns = false;
  local_50.m_chain = &this->super_abstract_message_chain_t;
  local_50.m_msg_type = msg_type;
  local_50.m_message = message;
  std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  if (this->m_status != closed) {
    complete_store_message_to_queue(this,&local_50,msg_type,message,demand_type);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return;
}

Assistant:

void
		try_to_store_message_from_timer_to_queue(
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as tracing base.
						*this, // as chain.
						msg_type,
						message,
						demand_type };

				std::unique_lock< std::mutex > lock{ m_lock };

				// Message cannot be stored to closed chain.
				if( details::status::closed == m_status )
					return;

				bool queue_full = m_queue.is_full();
				// NOTE: there is no awaiting on full mchain.
				// If queue full we must perform some reaction.
				if( queue_full )
					{
						const auto reaction = m_capacity.overflow_reaction();
						if( overflow_reaction_t::drop_newest == reaction ||
								overflow_reaction_t::throw_exception == reaction )
							{
								// New message must be simply ignored.
								tracer.overflow_drop_newest();
								return;
							}
						else if( overflow_reaction_t::remove_oldest == reaction )
							{
								// The oldest message must be simply removed.
								tracer.overflow_remove_oldest( m_queue.front() );
								m_queue.pop_front();
							}
						else
							{
								so_5::details::abort_on_fatal_error( [&] {
										tracer.overflow_throw_exception();
										SO_5_LOG_ERROR( m_env, log_stream ) {
											log_stream << "overflow_reaction_t::abort_app "
													"will be performed for mchain (id="
													<< m_id << "), msg_type: "
													<< msg_type.name()
													<< ". Application will be aborted"
													<< std::endl;
										}
									} );
							}
					}

				complete_store_message_to_queue(
						tracer,
						msg_type,
						message,
						demand_type );
			}